

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.cpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalOperator *op)

{
  LogicalOperatorType LVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  LogicalExtensionOperator *pLVar3;
  undefined4 extraout_var;
  LogicalExpressionGet *op_00;
  LogicalDummyScan *op_01;
  LogicalSample *op_02;
  LogicalCopyDatabase *op_03;
  LogicalAnyJoin *op_04;
  LogicalEmptyResult *op_05;
  LogicalCTERef *op_06;
  LogicalPivot *op_07;
  LogicalOrder *op_08;
  LogicalCopyToFile *op_09;
  LogicalDistinct *op_10;
  LogicalRecursiveCTE *op_11;
  LogicalTopN *op_12;
  LogicalProjection *op_13;
  LogicalAggregate *op_14;
  LogicalLimit *op_15;
  LogicalFilter *op_16;
  LogicalWindow *op_17;
  LogicalColumnDataGet *op_18;
  LogicalDelimGet *op_19;
  LogicalUnnest *op_20;
  LogicalPositionalJoin *op_21;
  LogicalUpdate *op_22;
  LogicalGet *op_23;
  LogicalPragma *op_24;
  LogicalMaterializedCTE *op_25;
  LogicalDelete *op_26;
  LogicalCreateTable *op_27;
  LogicalInsert *op_28;
  LogicalCrossProduct *op_29;
  LogicalCreateIndex *op_30;
  LogicalReset *op_31;
  LogicalExport *op_32;
  LogicalExecute *op_33;
  LogicalPrepare *op_34;
  LogicalVacuum *op_35;
  LogicalSet *op_36;
  LogicalCreateSecret *op_37;
  LogicalExplain *op_38;
  PhysicalOperator *pPVar4;
  NotImplementedException *this_00;
  InternalException *this_01;
  allocator local_39;
  string local_38;
  
  LVar1 = op->type;
  switch(LVar1) {
  case LOGICAL_INVALID:
  case LOGICAL_JOIN:
  case LOGICAL_DEPENDENT_JOIN:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Unimplemented logical operator type!",&local_39);
    NotImplementedException::NotImplementedException(this_00,&local_38);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case LOGICAL_PROJECTION:
    op_13 = LogicalOperator::Cast<duckdb::LogicalProjection>(op);
    pPVar4 = CreatePlan(this,op_13);
    return pPVar4;
  case LOGICAL_FILTER:
    op_16 = LogicalOperator::Cast<duckdb::LogicalFilter>(op);
    pPVar4 = CreatePlan(this,op_16);
    return pPVar4;
  case LOGICAL_AGGREGATE_AND_GROUP_BY:
    op_14 = LogicalOperator::Cast<duckdb::LogicalAggregate>(op);
    pPVar4 = CreatePlan(this,op_14);
    return pPVar4;
  case LOGICAL_WINDOW:
    op_17 = LogicalOperator::Cast<duckdb::LogicalWindow>(op);
    pPVar4 = CreatePlan(this,op_17);
    return pPVar4;
  case LOGICAL_UNNEST:
    op_20 = LogicalOperator::Cast<duckdb::LogicalUnnest>(op);
    pPVar4 = CreatePlan(this,op_20);
    return pPVar4;
  case LOGICAL_LIMIT:
    op_15 = LogicalOperator::Cast<duckdb::LogicalLimit>(op);
    pPVar4 = CreatePlan(this,op_15);
    return pPVar4;
  case LOGICAL_ORDER_BY:
    op_08 = LogicalOperator::Cast<duckdb::LogicalOrder>(op);
    pPVar4 = CreatePlan(this,op_08);
    return pPVar4;
  case LOGICAL_TOP_N:
    op_12 = LogicalOperator::Cast<duckdb::LogicalTopN>(op);
    pPVar4 = CreatePlan(this,op_12);
    return pPVar4;
  case LOGICAL_TOP_N|LOGICAL_PROJECTION:
  case LOGICAL_SAMPLE|LOGICAL_PROJECTION:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case ~(LOGICAL_CREATE_SEQUENCE|LOGICAL_UPDATE|LOGICAL_PROJECTION):
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case ~(LOGICAL_CREATE_SEQUENCE|LOGICAL_MATERIALIZED_CTE):
  case ~(LOGICAL_CREATE_SEQUENCE|LOGICAL_RECURSIVE_CTE):
  case LOGICAL_ASOF_JOIN|LOGICAL_FILTER:
  case LOGICAL_ASOF_JOIN|LOGICAL_AGGREGATE_AND_GROUP_BY:
  case LOGICAL_ASOF_JOIN|LOGICAL_WINDOW:
  case LOGICAL_ASOF_JOIN|LOGICAL_UNNEST:
  case LOGICAL_ASOF_JOIN|LOGICAL_LIMIT:
  case LOGICAL_ASOF_JOIN|LOGICAL_ORDER_BY:
  case ~(LOGICAL_CREATE_SECRET|LOGICAL_PROJECTION):
  case ~LOGICAL_CREATE_SECRET:
  case ~(LOGICAL_EXECUTE|LOGICAL_SAMPLE|LOGICAL_PROJECTION):
  case ~(LOGICAL_EXECUTE|LOGICAL_SAMPLE):
  case ~(LOGICAL_EXECUTE|LOGICAL_DISTINCT):
  case ~(LOGICAL_EXECUTE|LOGICAL_COPY_TO_FILE):
  case ~(LOGICAL_EXECUTE|LOGICAL_TOP_N|LOGICAL_PROJECTION):
  case ~(LOGICAL_EXECUTE|LOGICAL_TOP_N):
  case ~(LOGICAL_UPDATE_EXTENSIONS|LOGICAL_PROJECTION):
  case ~LOGICAL_UPDATE_EXTENSIONS:
  case ~LOGICAL_RESET:
    goto switchD_004008c7_caseD_9;
  case LOGICAL_COPY_TO_FILE:
    op_09 = LogicalOperator::Cast<duckdb::LogicalCopyToFile>(op);
    pPVar4 = CreatePlan(this,op_09);
    return pPVar4;
  case LOGICAL_DISTINCT:
    op_10 = LogicalOperator::Cast<duckdb::LogicalDistinct>(op);
    pPVar4 = CreatePlan(this,op_10);
    return pPVar4;
  case LOGICAL_SAMPLE:
    op_02 = LogicalOperator::Cast<duckdb::LogicalSample>(op);
    pPVar4 = CreatePlan(this,op_02);
    return pPVar4;
  case LOGICAL_PIVOT:
    op_07 = LogicalOperator::Cast<duckdb::LogicalPivot>(op);
    pPVar4 = CreatePlan(this,op_07);
    return pPVar4;
  case LOGICAL_COPY_DATABASE:
    op_03 = LogicalOperator::Cast<duckdb::LogicalCopyDatabase>(op);
    pPVar4 = CreatePlan(this,op_03);
    return pPVar4;
  case LOGICAL_GET:
    op_23 = LogicalOperator::Cast<duckdb::LogicalGet>(op);
    pPVar4 = CreatePlan(this,op_23);
    return pPVar4;
  case LOGICAL_CHUNK_GET:
    op_18 = LogicalOperator::Cast<duckdb::LogicalColumnDataGet>(op);
    pPVar4 = CreatePlan(this,op_18);
    return pPVar4;
  case LOGICAL_DELIM_GET:
    op_19 = LogicalOperator::Cast<duckdb::LogicalDelimGet>(op);
    pPVar4 = CreatePlan(this,op_19);
    return pPVar4;
  case LOGICAL_EXPRESSION_GET:
    op_00 = LogicalOperator::Cast<duckdb::LogicalExpressionGet>(op);
    pPVar4 = CreatePlan(this,op_00);
    return pPVar4;
  case LOGICAL_DUMMY_SCAN:
    op_01 = LogicalOperator::Cast<duckdb::LogicalDummyScan>(op);
    pPVar4 = CreatePlan(this,op_01);
    return pPVar4;
  case LOGICAL_EMPTY_RESULT:
    op_05 = LogicalOperator::Cast<duckdb::LogicalEmptyResult>(op);
    pPVar4 = CreatePlan(this,op_05);
    return pPVar4;
  case LOGICAL_CTE_REF:
    op_06 = LogicalOperator::Cast<duckdb::LogicalCTERef>(op);
    pPVar4 = CreatePlan(this,op_06);
    return pPVar4;
  case LOGICAL_DELIM_JOIN:
  case LOGICAL_COMPARISON_JOIN:
  case LOGICAL_ASOF_JOIN:
    pPVar4 = CreatePlan(this,(LogicalComparisonJoin *)op);
    return pPVar4;
  case LOGICAL_ANY_JOIN:
    op_04 = LogicalOperator::Cast<duckdb::LogicalAnyJoin>(op);
    pPVar4 = CreatePlan(this,op_04);
    return pPVar4;
  case LOGICAL_CROSS_PRODUCT:
    op_29 = LogicalOperator::Cast<duckdb::LogicalCrossProduct>(op);
    pPVar4 = CreatePlan(this,op_29);
    return pPVar4;
  case LOGICAL_POSITIONAL_JOIN:
    op_21 = LogicalOperator::Cast<duckdb::LogicalPositionalJoin>(op);
    pPVar4 = CreatePlan(this,op_21);
    return pPVar4;
  case LOGICAL_UNION:
  case LOGICAL_EXCEPT:
  case LOGICAL_INTERSECT:
    pPVar4 = CreatePlan(this,(LogicalSetOperation *)op);
    return pPVar4;
  case LOGICAL_RECURSIVE_CTE:
    op_11 = LogicalOperator::Cast<duckdb::LogicalRecursiveCTE>(op);
    pPVar4 = CreatePlan(this,op_11);
    return pPVar4;
  case LOGICAL_MATERIALIZED_CTE:
    op_25 = LogicalOperator::Cast<duckdb::LogicalMaterializedCTE>(op);
    pPVar4 = CreatePlan(this,op_25);
    return pPVar4;
  default:
    switch(LVar1) {
    case LOGICAL_INSERT:
      op_28 = LogicalOperator::Cast<duckdb::LogicalInsert>(op);
      pPVar4 = CreatePlan(this,op_28);
      return pPVar4;
    case LOGICAL_DELETE:
      op_26 = LogicalOperator::Cast<duckdb::LogicalDelete>(op);
      pPVar4 = CreatePlan(this,op_26);
      return pPVar4;
    case LOGICAL_UPDATE:
      op_22 = LogicalOperator::Cast<duckdb::LogicalUpdate>(op);
      pPVar4 = CreatePlan(this,op_22);
      return pPVar4;
    case LOGICAL_UPDATE|LOGICAL_PROJECTION:
    case ~(LOGICAL_EXPLAIN|LOGICAL_PROJECTION):
    case ~LOGICAL_EXPLAIN:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case ~(LOGICAL_ATTACH|LOGICAL_ORDER_BY):
    case ~(LOGICAL_ATTACH|LOGICAL_LIMIT):
    case ~(LOGICAL_ATTACH|LOGICAL_UNNEST):
    case ~(LOGICAL_ATTACH|LOGICAL_WINDOW):
    case ~(LOGICAL_ATTACH|LOGICAL_AGGREGATE_AND_GROUP_BY):
    case ~(LOGICAL_ATTACH|LOGICAL_FILTER):
    case ~LOGICAL_DETACH:
    case ~LOGICAL_ATTACH:
    case ~LOGICAL_CREATE_TYPE:
    case ~LOGICAL_TRANSACTION:
    case ~LOGICAL_PRAGMA:
    case ~LOGICAL_DROP:
    case ~LOGICAL_CREATE_MACRO:
      break;
    case LOGICAL_ALTER:
    case LOGICAL_DROP:
    case LOGICAL_TRANSACTION:
    case LOGICAL_ATTACH:
    case LOGICAL_DETACH:
switchD_004008ef_caseD_7d:
      pPVar4 = CreatePlan(this,(LogicalSimple *)op);
      return pPVar4;
    case LOGICAL_CREATE_TABLE:
      op_27 = LogicalOperator::Cast<duckdb::LogicalCreateTable>(op);
      pPVar4 = CreatePlan(this,op_27);
      return pPVar4;
    case LOGICAL_CREATE_INDEX:
      op_30 = LogicalOperator::Cast<duckdb::LogicalCreateIndex>(op);
      pPVar4 = CreatePlan(this,op_30);
      return pPVar4;
    case LOGICAL_CREATE_SEQUENCE:
    case LOGICAL_CREATE_VIEW:
    case LOGICAL_CREATE_SCHEMA:
    case LOGICAL_CREATE_MACRO:
    case LOGICAL_CREATE_TYPE:
      pPVar4 = CreatePlan(this,(LogicalCreate *)op);
      return pPVar4;
    case LOGICAL_PRAGMA:
      op_24 = LogicalOperator::Cast<duckdb::LogicalPragma>(op);
      pPVar4 = CreatePlan(this,op_24);
      return pPVar4;
    default:
      switch(LVar1) {
      case LOGICAL_PREPARE:
        op_34 = LogicalOperator::Cast<duckdb::LogicalPrepare>(op);
        pPVar4 = CreatePlan(this,op_34);
        return pPVar4;
      case LOGICAL_EXECUTE:
        op_33 = LogicalOperator::Cast<duckdb::LogicalExecute>(op);
        pPVar4 = CreatePlan(this,op_33);
        return pPVar4;
      case LOGICAL_EXPORT:
        op_32 = LogicalOperator::Cast<duckdb::LogicalExport>(op);
        pPVar4 = CreatePlan(this,op_32);
        return pPVar4;
      case LOGICAL_VACUUM:
        op_35 = LogicalOperator::Cast<duckdb::LogicalVacuum>(op);
        pPVar4 = CreatePlan(this,op_35);
        return pPVar4;
      case LOGICAL_SET:
        op_36 = LogicalOperator::Cast<duckdb::LogicalSet>(op);
        pPVar4 = CreatePlan(this,op_36);
        return pPVar4;
      case LOGICAL_LOAD:
      case LOGICAL_UPDATE_EXTENSIONS:
        goto switchD_004008ef_caseD_7d;
      case LOGICAL_RESET:
        op_31 = LogicalOperator::Cast<duckdb::LogicalReset>(op);
        pPVar4 = CreatePlan(this,op_31);
        return pPVar4;
      case LOGICAL_UPDATE_EXTENSIONS|LOGICAL_PROJECTION:
      case LOGICAL_EXECUTE|LOGICAL_TOP_N:
      case LOGICAL_EXECUTE|LOGICAL_TOP_N|LOGICAL_PROJECTION:
      case LOGICAL_EXECUTE|LOGICAL_COPY_TO_FILE:
      case LOGICAL_EXECUTE|LOGICAL_DISTINCT:
      case LOGICAL_EXECUTE|LOGICAL_SAMPLE:
      case LOGICAL_EXECUTE|LOGICAL_SAMPLE|LOGICAL_PROJECTION:
        break;
      case LOGICAL_CREATE_SECRET:
        op_37 = LogicalOperator::Cast<duckdb::LogicalCreateSecret>(op);
        pPVar4 = CreatePlan(this,op_37);
        return pPVar4;
      default:
        if (LVar1 == LOGICAL_EXPLAIN) {
          op_38 = LogicalOperator::Cast<duckdb::LogicalExplain>(op);
          pPVar4 = CreatePlan(this,op_38);
          return pPVar4;
        }
        if (LVar1 == LOGICAL_EXTENSION_OPERATOR) {
          pLVar3 = LogicalOperator::Cast<duckdb::LogicalExtensionOperator>(op);
          UNRECOVERED_JUMPTABLE = (pLVar3->super_LogicalOperator)._vptr_LogicalOperator[0xf];
          iVar2 = (*UNRECOVERED_JUMPTABLE)(pLVar3,this->context,this,UNRECOVERED_JUMPTABLE);
          return (PhysicalOperator *)CONCAT44(extraout_var,iVar2);
        }
      }
    }
switchD_004008c7_caseD_9:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Physical plan generator - no plan generated",&local_39);
    InternalException::InternalException(this_01,&local_38);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalOperator &op) {
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_GET:
		return CreatePlan(op.Cast<LogicalGet>());
	case LogicalOperatorType::LOGICAL_PROJECTION:
		return CreatePlan(op.Cast<LogicalProjection>());
	case LogicalOperatorType::LOGICAL_EMPTY_RESULT:
		return CreatePlan(op.Cast<LogicalEmptyResult>());
	case LogicalOperatorType::LOGICAL_FILTER:
		return CreatePlan(op.Cast<LogicalFilter>());
	case LogicalOperatorType::LOGICAL_AGGREGATE_AND_GROUP_BY:
		return CreatePlan(op.Cast<LogicalAggregate>());
	case LogicalOperatorType::LOGICAL_WINDOW:
		return CreatePlan(op.Cast<LogicalWindow>());
	case LogicalOperatorType::LOGICAL_UNNEST:
		return CreatePlan(op.Cast<LogicalUnnest>());
	case LogicalOperatorType::LOGICAL_LIMIT:
		return CreatePlan(op.Cast<LogicalLimit>());
	case LogicalOperatorType::LOGICAL_SAMPLE:
		return CreatePlan(op.Cast<LogicalSample>());
	case LogicalOperatorType::LOGICAL_ORDER_BY:
		return CreatePlan(op.Cast<LogicalOrder>());
	case LogicalOperatorType::LOGICAL_TOP_N:
		return CreatePlan(op.Cast<LogicalTopN>());
	case LogicalOperatorType::LOGICAL_COPY_TO_FILE:
		return CreatePlan(op.Cast<LogicalCopyToFile>());
	case LogicalOperatorType::LOGICAL_DUMMY_SCAN:
		return CreatePlan(op.Cast<LogicalDummyScan>());
	case LogicalOperatorType::LOGICAL_ANY_JOIN:
		return CreatePlan(op.Cast<LogicalAnyJoin>());
	case LogicalOperatorType::LOGICAL_ASOF_JOIN:
	case LogicalOperatorType::LOGICAL_DELIM_JOIN:
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
		return CreatePlan(op.Cast<LogicalComparisonJoin>());
	case LogicalOperatorType::LOGICAL_CROSS_PRODUCT:
		return CreatePlan(op.Cast<LogicalCrossProduct>());
	case LogicalOperatorType::LOGICAL_POSITIONAL_JOIN:
		return CreatePlan(op.Cast<LogicalPositionalJoin>());
	case LogicalOperatorType::LOGICAL_UNION:
	case LogicalOperatorType::LOGICAL_EXCEPT:
	case LogicalOperatorType::LOGICAL_INTERSECT:
		return CreatePlan(op.Cast<LogicalSetOperation>());
	case LogicalOperatorType::LOGICAL_INSERT:
		return CreatePlan(op.Cast<LogicalInsert>());
	case LogicalOperatorType::LOGICAL_DELETE:
		return CreatePlan(op.Cast<LogicalDelete>());
	case LogicalOperatorType::LOGICAL_CHUNK_GET:
		return CreatePlan(op.Cast<LogicalColumnDataGet>());
	case LogicalOperatorType::LOGICAL_DELIM_GET:
		return CreatePlan(op.Cast<LogicalDelimGet>());
	case LogicalOperatorType::LOGICAL_EXPRESSION_GET:
		return CreatePlan(op.Cast<LogicalExpressionGet>());
	case LogicalOperatorType::LOGICAL_UPDATE:
		return CreatePlan(op.Cast<LogicalUpdate>());
	case LogicalOperatorType::LOGICAL_CREATE_TABLE:
		return CreatePlan(op.Cast<LogicalCreateTable>());
	case LogicalOperatorType::LOGICAL_CREATE_INDEX:
		return CreatePlan(op.Cast<LogicalCreateIndex>());
	case LogicalOperatorType::LOGICAL_CREATE_SECRET:
		return CreatePlan(op.Cast<LogicalCreateSecret>());
	case LogicalOperatorType::LOGICAL_EXPLAIN:
		return CreatePlan(op.Cast<LogicalExplain>());
	case LogicalOperatorType::LOGICAL_DISTINCT:
		return CreatePlan(op.Cast<LogicalDistinct>());
	case LogicalOperatorType::LOGICAL_PREPARE:
		return CreatePlan(op.Cast<LogicalPrepare>());
	case LogicalOperatorType::LOGICAL_EXECUTE:
		return CreatePlan(op.Cast<LogicalExecute>());
	case LogicalOperatorType::LOGICAL_CREATE_VIEW:
	case LogicalOperatorType::LOGICAL_CREATE_SEQUENCE:
	case LogicalOperatorType::LOGICAL_CREATE_SCHEMA:
	case LogicalOperatorType::LOGICAL_CREATE_MACRO:
	case LogicalOperatorType::LOGICAL_CREATE_TYPE:
		return CreatePlan(op.Cast<LogicalCreate>());
	case LogicalOperatorType::LOGICAL_PRAGMA:
		return CreatePlan(op.Cast<LogicalPragma>());
	case LogicalOperatorType::LOGICAL_VACUUM:
		return CreatePlan(op.Cast<LogicalVacuum>());
	case LogicalOperatorType::LOGICAL_TRANSACTION:
	case LogicalOperatorType::LOGICAL_ALTER:
	case LogicalOperatorType::LOGICAL_DROP:
	case LogicalOperatorType::LOGICAL_LOAD:
	case LogicalOperatorType::LOGICAL_ATTACH:
	case LogicalOperatorType::LOGICAL_DETACH:
		return CreatePlan(op.Cast<LogicalSimple>());
	case LogicalOperatorType::LOGICAL_RECURSIVE_CTE:
		return CreatePlan(op.Cast<LogicalRecursiveCTE>());
	case LogicalOperatorType::LOGICAL_MATERIALIZED_CTE:
		return CreatePlan(op.Cast<LogicalMaterializedCTE>());
	case LogicalOperatorType::LOGICAL_CTE_REF:
		return CreatePlan(op.Cast<LogicalCTERef>());
	case LogicalOperatorType::LOGICAL_EXPORT:
		return CreatePlan(op.Cast<LogicalExport>());
	case LogicalOperatorType::LOGICAL_SET:
		return CreatePlan(op.Cast<LogicalSet>());
	case LogicalOperatorType::LOGICAL_RESET:
		return CreatePlan(op.Cast<LogicalReset>());
	case LogicalOperatorType::LOGICAL_PIVOT:
		return CreatePlan(op.Cast<LogicalPivot>());
	case LogicalOperatorType::LOGICAL_COPY_DATABASE:
		return CreatePlan(op.Cast<LogicalCopyDatabase>());
	case LogicalOperatorType::LOGICAL_UPDATE_EXTENSIONS:
		return CreatePlan(op.Cast<LogicalSimple>());
	case LogicalOperatorType::LOGICAL_EXTENSION_OPERATOR: {
		auto &extension_op = op.Cast<LogicalExtensionOperator>();
		return extension_op.CreatePlan(context, *this);
	}
	case LogicalOperatorType::LOGICAL_JOIN:
	case LogicalOperatorType::LOGICAL_DEPENDENT_JOIN:
	case LogicalOperatorType::LOGICAL_INVALID: {
		throw NotImplementedException("Unimplemented logical operator type!");
	}
	}
	throw InternalException("Physical plan generator - no plan generated");
}